

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
::clear(raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
        *this)

{
  long lVar1;
  size_t i;
  size_t sVar2;
  size_t sVar3;
  
  if (this->size_ == 0) {
    return;
  }
  sVar3 = this->capacity_;
  if (sVar3 != 0) {
    lVar1 = 0;
    for (sVar2 = 0; sVar2 != sVar3; sVar2 = sVar2 + 1) {
      if (-1 < this->ctrl_[sVar2]) {
        node_hash_policy<phmap::priv::hash_internal::Enum&,phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>>
        ::destroy<phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>
                  ((Alloc<phmap::priv::hash_internal::Enum> *)&this->settings_,
                   (slot_type *)((long)this->slots_ + lVar1));
        sVar3 = this->capacity_;
      }
      lVar1 = lVar1 + 8;
    }
    this->size_ = 0;
    memset(this->ctrl_,0x80,sVar3 + 0x10);
    this->ctrl_[sVar3] = -1;
    reset_growth_left(this,this->capacity_);
    if (this->size_ == 0) {
      return;
    }
  }
  __assert_fail("empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x50a,
                "void phmap::priv::raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>::clear() [Policy = phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<phmap::priv::hash_internal::Enum>]"
               );
}

Assistant:

bool empty() const { return !size(); }